

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall
icu_63::FractionalPartSubstitution::FractionalPartSubstitution
          (FractionalPartSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  int8_t iVar1;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58 [3];
  UChar *local_40;
  UChar *local_38;
  UChar *local_30;
  
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,description,status);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__FractionalPartSubstitution_003cae28;
  this->byDigits = '\0';
  this->useSpaces = '\x01';
  local_68.p_ = L">>";
  iVar1 = UnicodeString::compare(description,&local_68,2);
  if (iVar1 == '\0') {
    local_40 = local_68.p_;
  }
  else {
    local_58[0].p_ = L">>>";
    iVar1 = UnicodeString::compare(description,local_58,3);
    local_30 = local_58[0].p_;
    local_38 = local_68.p_;
    if ((iVar1 != '\0') && ((this->super_NFSubstitution).ruleSet != _ruleSet)) {
      ((this->super_NFSubstitution).ruleSet)->fIsFractionRuleSet = '\x01';
      return;
    }
  }
  this->byDigits = '\x01';
  local_60.p_ = L">>>";
  iVar1 = UnicodeString::compare(description,&local_60,3);
  if (iVar1 == '\0') {
    this->useSpaces = '\0';
  }
  return;
}

Assistant:

FractionalPartSubstitution::FractionalPartSubstitution(int32_t _pos,
                             const NFRuleSet* _ruleSet,
                             const UnicodeString& description,
                             UErrorCode& status)
 : NFSubstitution(_pos, _ruleSet, description, status)
 , byDigits(FALSE)
 , useSpaces(TRUE)

{
    // akk, ruleSet can change in superclass constructor
    if (0 == description.compare(gGreaterGreaterThan, 2) ||
        0 == description.compare(gGreaterGreaterGreaterThan, 3) ||
        _ruleSet == getRuleSet()) {
        byDigits = TRUE;
        if (0 == description.compare(gGreaterGreaterGreaterThan, 3)) {
            useSpaces = FALSE;
        }
    } else {
        // cast away const
        ((NFRuleSet*)getRuleSet())->makeIntoFractionRuleSet();
    }
}